

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> __thiscall
iDynTree::optimalcontrol::integrators::Integrator::dynamicalSystem(Integrator *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> wVar2;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> wVar3;
  
  in_RDI->_vptr_DynamicalSystem =
       (_func_int **)
       (this->m_dynamicalSystem_ptr).
       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (this->m_dynamicalSystem_ptr).
           super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  in_RDI->m_stateSize = (size_t)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      wVar2.super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      wVar2.super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = in_RDI;
      return (weak_ptr<iDynTree::optimalcontrol::DynamicalSystem>)
             wVar2.
             super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    UNLOCK();
  }
  wVar3.super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  wVar3.super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (weak_ptr<iDynTree::optimalcontrol::DynamicalSystem>)
         wVar3.
         super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const std::weak_ptr<DynamicalSystem> Integrator::dynamicalSystem() const{
                return m_dynamicalSystem_ptr;
            }